

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

int __thiscall
leveldb::anon_unknown_0::ReverseKeyComparator::Compare(ReverseKeyComparator *this,Slice *a,Slice *b)

{
  int iVar1;
  Comparator *pCVar2;
  string local_78;
  pointer local_58;
  size_type sStack_50;
  string local_48;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  pCVar2 = BytewiseComparator();
  Reverse_abi_cxx11_(&local_48,(leveldb *)a->data_,(Slice *)a->size_);
  local_58 = local_48._M_dataplus._M_p;
  sStack_50 = local_48._M_string_length;
  Reverse_abi_cxx11_(&local_78,(leveldb *)b->data_,(Slice *)b->size_);
  local_28 = local_78._M_dataplus._M_p._0_4_;
  uStack_24 = local_78._M_dataplus._M_p._4_4_;
  uStack_20 = (undefined4)local_78._M_string_length;
  uStack_1c = local_78._M_string_length._4_4_;
  iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
      &local_78.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return iVar1;
}

Assistant:

int Compare(const Slice& a, const Slice& b) const override {
    return BytewiseComparator()->Compare(Reverse(a), Reverse(b));
  }